

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O0

void Gme_File::copy_field_(char *out,char *in,int in_size)

{
  int iVar1;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar2;
  int len;
  int local_18;
  int local_14;
  char *local_10;
  
  if ((in_RSI != (char *)0x0) && (local_14 = in_EDX, local_10 = in_RSI, *in_RSI != '\0')) {
    while( true ) {
      bVar2 = false;
      if (local_14 != 0) {
        bVar2 = (int)*local_10 - 1U < 0x20;
      }
      if (!bVar2) break;
      local_10 = local_10 + 1;
      local_14 = local_14 + -1;
    }
    if (0xff < local_14) {
      local_14 = 0xff;
    }
    local_18 = 0;
    while( true ) {
      bVar2 = false;
      if (local_18 < local_14) {
        bVar2 = local_10[local_18] != '\0';
      }
      if (!bVar2) break;
      local_18 = local_18 + 1;
    }
    while( true ) {
      bVar2 = false;
      if (local_18 != 0) {
        bVar2 = (byte)local_10[local_18 + -1] < 0x21;
      }
      if (!bVar2) break;
      local_18 = local_18 + -1;
    }
    in_RDI[local_18] = '\0';
    memcpy(in_RDI,local_10,(long)local_18);
    iVar1 = strcmp(in_RDI,"?");
    if (((iVar1 == 0) || (iVar1 = strcmp(in_RDI,"<?>"), iVar1 == 0)) ||
       (iVar1 = strcmp(in_RDI,"< ? >"), iVar1 == 0)) {
      *in_RDI = '\0';
    }
  }
  return;
}

Assistant:

void Gme_File::copy_field_( char* out, const char* in, int in_size )
{
	if ( !in || !*in )
		return;
	
	// remove spaces/junk from beginning
	while ( in_size && unsigned (*in - 1) <= ' ' - 1 )
	{
		in++;
		in_size--;
	}
	
	// truncate
	if ( in_size > max_field_ )
		in_size = max_field_;
	
	// find terminator
	int len = 0;
	while ( len < in_size && in [len] )
		len++;
	
	// remove spaces/junk from end
	while ( len && unsigned (in [len - 1]) <= ' ' )
		len--;
	
	// copy
	out [len] = 0;
	memcpy( out, in, len );
	
	// strip out stupid fields that should have been left blank
	if ( !strcmp( out, "?" ) || !strcmp( out, "<?>" ) || !strcmp( out, "< ? >" ) )
		out [0] = 0;
}